

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBar::mouseDoubleClickEvent(QTabBar *this,QMouseEvent *event)

{
  long lVar1;
  long lVar2;
  char cVar3;
  ulong uVar4;
  undefined4 extraout_EDX;
  uint uVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  double dVar7;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QPoint pos;
  QPoint local_48;
  int local_3c;
  void *local_38;
  int *piStack_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  local_48 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
  dVar7 = (double)QEventPoint::position();
  auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar9._8_8_ = (double)((ulong)dVar7 & 0x8000000000000000 | 0x3fe0000000000000) + dVar7;
  auVar9 = minpd(_DAT_0066f5d0,auVar9);
  auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
  auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
  uVar5 = movmskpd(extraout_EDX,auVar8);
  uVar6 = 0x8000000000000000;
  if ((uVar5 & 1) != 0) {
    uVar6 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
  }
  uVar4 = 0x80000000;
  if ((uVar5 & 2) != 0) {
    uVar4 = (ulong)(uint)(int)auVar9._8_8_;
  }
  local_48 = (QPoint)(uVar4 | uVar6);
  lVar2 = *(long *)(*(long *)(lVar1 + 0x290) + 0x20);
  if ((*(byte *)(lVar2 + 10) & 1) == 0) {
    cVar3 = QRect::contains((QPoint *)(lVar2 + 0x14),SUB81(&local_48,0));
    if (cVar3 != '\0') goto LAB_00497987;
  }
  lVar1 = *(long *)(*(long *)(lVar1 + 0x288) + 0x20);
  if ((*(byte *)(lVar1 + 10) & 1) == 0) {
    cVar3 = QRect::contains((QPoint *)(lVar1 + 0x14),SUB81(&local_48,0));
    if (cVar3 != '\0') goto LAB_00497987;
  }
  local_3c = tabAt(this,&local_48);
  piStack_30 = &local_3c;
  local_38 = (void *)0x0;
  QMetaObject::activate((QObject *)this,&staticMetaObject,4,&local_38);
LAB_00497987:
  (**(code **)(*(long *)&this->super_QWidget + 0x98))(this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTabBar::mouseDoubleClickEvent(QMouseEvent *event)
{
    Q_D(QTabBar);
    const QPoint pos = event->position().toPoint();
    const bool isEventInCornerButtons = (!d->leftB->isHidden() && d->leftB->geometry().contains(pos))
                                        || (!d->rightB->isHidden() && d->rightB->geometry().contains(pos));
    if (!isEventInCornerButtons)
        emit tabBarDoubleClicked(tabAt(pos));

    mousePressEvent(event);
}